

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.h
# Opt level: O2

array<int,_allocator_default<int>_> * __thiscall
allocator_default<array<int,_allocator_default<int>_>_>::alloc_array
          (allocator_default<array<int,_allocator_default<int>_>_> *this,int size)

{
  long *plVar1;
  ulong uVar2;
  long lVar3;
  undefined4 in_register_00000034;
  int iVar4;
  array<int,_allocator_default<int>_> *this_00;
  long lVar5;
  
  iVar4 = (int)this;
  lVar3 = (long)iVar4 * 0x10;
  uVar2 = 0xffffffffffffffff;
  if (-1 < iVar4) {
    uVar2 = lVar3 + 8;
  }
  plVar1 = (long *)operator_new__(uVar2);
  *plVar1 = (long)iVar4;
  if (iVar4 != 0) {
    lVar5 = 0;
    this_00 = (array<int,_allocator_default<int>_> *)(plVar1 + 1);
    do {
      array<int,_allocator_default<int>_>::init
                (this_00,(EVP_PKEY_CTX *)CONCAT44(in_register_00000034,size));
      lVar5 = lVar5 + -0x10;
      this_00 = this_00 + 1;
    } while (-lVar5 != lVar3);
  }
  return (array<int,_allocator_default<int>_> *)(plVar1 + 1);
}

Assistant:

static T *alloc_array(int size) { return new T [size]; }